

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O2

SearchStatus __thiscall tsbp::LeftmostActiveOnly::SolveParallelNative(LeftmostActiveOnly *this)

{
  _Storage<int,_true> _Var1;
  _Storage<int,_true> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  double dVar5;
  SearchStatus SVar6;
  ostream *poVar7;
  char *pcVar8;
  _Storage<int,_true> *p_Var9;
  atomic<bool> isFeasible;
  atomic<bool> feasibleSolutionCancellationToken;
  SearchStatus status;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  begin;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  endLast;
  atomic<long> exploredNodes;
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  subtrees;
  undefined8 local_1a8;
  pointer puStack_1a0;
  SearchStatus *local_198;
  mutex *local_190;
  Packing2D *local_188;
  atomic<bool> *local_180;
  atomic<long> *local_178;
  atomic<unsigned_long> *local_170;
  LeftmostActiveOnly *local_168;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  *local_160;
  atomic<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  atomic<unsigned_long> exploredSubtrees;
  Packing2D solution;
  mutex mutex;
  
  begin._M_i.__d.__r =
       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        )std::chrono::_V2::steady_clock::now();
  feasibleSolutionCancellationToken._M_base._M_i = (__atomic_base<bool>)false;
  subtrees.
  super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subtrees.
  super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subtrees.
  super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  endLast._M_i.__d.__r = begin._M_i.__d.__r;
  std::
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ::reserve(&subtrees,
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5);
  p_Var2 = (_Storage<int,_true> *)
           (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (p_Var9 = (_Storage<int,_true> *)
                (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; p_Var9 != p_Var2; p_Var9 = p_Var9 + 1) {
    _Var1 = (_Storage<int,_true>)p_Var9->_M_value;
    std::make_unique<tsbp::LeftmostActiveOnly,tsbp::InputParameters&>((InputParameters *)&solution);
    uVar3 = *(undefined8 *)&(this->container).super_Rectangle;
    uVar4 = *(undefined8 *)&(this->container).super_Rectangle.Dx;
    dVar5 = (this->container).super_Rectangle.Area;
    *(undefined8 *)(solution._0_8_ + 0xd8) =
         *(undefined8 *)&(this->container).super_Rectangle.InternId;
    *(double *)(solution._0_8_ + 0xe0) = dVar5;
    *(undefined8 *)(solution._0_8_ + 200) = uVar3;
    *(undefined8 *)(solution._0_8_ + 0xd0) = uVar4;
    local_1a8._4_1_ = true;
    local_1a8._0_4_ = (_Storage<int,_true>)(_Storage<int,_true>)_Var1._M_value;
    AddItems((LeftmostActiveOnly *)solution._0_8_,&this->items,(optional<int> *)&local_1a8,
             &this->fixedItemCoordinatesX);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(solution._0_8_ + 0x68),&this->branchingOrder);
    *(atomic<bool> **)(solution._0_8_ + 0x80) = &feasibleSolutionCancellationToken;
    std::
    vector<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>,std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>>>
    ::
    emplace_back<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>>
              ((vector<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>,std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,std::default_delete<tsbp::LeftmostActiveOnly>>>>
                *)&subtrees,
               (unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>
                *)&solution);
    if (solution._0_8_ != 0) {
      (**(code **)(*(long *)solution._0_8_ + 8))();
    }
  }
  status = None;
  exploredSubtrees.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  exploredNodes.super___atomic_base<long>._M_i = (__atomic_base<long>)0;
  isFeasible._M_base._M_i = (__atomic_base<bool>)false;
  memset(&solution,0,0x88);
  solution.ReducedItemInfeasiblePlacementPoints = 0xffffffffffffffff;
  solution.IsReducedItemPlaced = false;
  solution.IsFixedItemPlaced = false;
  local_190 = &mutex;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_1a8 = (_Optional_payload_base<int>)
              subtrees.
              super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  puStack_1a0 = subtrees.
                super__Vector_base<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_160 = &endLast;
  local_158 = &begin;
  local_140._M_dataplus._M_p = (pointer)&PTR_operator___00173590;
  local_140._M_string_length = (size_type)&local_1a8;
  local_198 = &status;
  local_188 = &solution;
  local_180 = &isFeasible;
  local_178 = &exploredNodes;
  local_170 = &exploredSubtrees;
  local_168 = this;
  tbb::detail::r1::isolate_within_arena((delegate_base *)&local_140,0);
  if (status == Abort) {
    std::operator<<((ostream *)&std::cout,"Search was aborted.\n");
  }
  else {
    if (((byte)isFeasible._M_base._M_i & 1) == 0) {
      pcVar8 = "Problem is infeasible.\n";
      status = Infeasible;
    }
    else {
      Packing2D::operator=(&this->solution,&solution);
      pcVar8 = "Feasible solution found.\n";
      status = Feasible;
    }
    std::operator<<((ostream *)&std::cout,pcVar8);
    std::chrono::_V2::steady_clock::now();
    poVar7 = std::operator<<((ostream *)&std::cout,"Elapsed time until after for_each() = ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::operator<<(poVar7,"s\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"Termination delay = ");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::operator<<(poVar7,"s\n");
    CLI::std::__cxx11::to_string(&local_120,(long)exploredNodes.super___atomic_base<long>._M_i);
    std::operator+(&local_140,"Total explored nodes = ",&local_120);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                   &local_140,"\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
  }
  SVar6 = status;
  Packing2D::~Packing2D(&solution);
  std::
  vector<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>,_std::allocator<std::unique_ptr<tsbp::LeftmostActiveOnly,_std::default_delete<tsbp::LeftmostActiveOnly>_>_>_>
  ::~vector(&subtrees);
  return SVar6;
}

Assistant:

SearchStatus LeftmostActiveOnly::SolveParallelNative()
{
    std::atomic<std::chrono::steady_clock::time_point> begin = std::chrono::steady_clock::now();
    std::atomic<std::chrono::steady_clock::time_point> endLast = begin.load();

    std::atomic<bool> feasibleSolutionCancellationToken = false;

    std::vector<std::unique_ptr<LeftmostActiveOnly>> subtrees;
    subtrees.reserve(items.size());
    ////for (size_t i = 0; i < 1; i++)
    for (size_t itemId: this->branchingOrder)
    {
        std::unique_ptr<LeftmostActiveOnly> lmao = std::make_unique<LeftmostActiveOnly>(this->parameters);
        lmao->AddContainer(container);
        lmao->AddItems(items, itemId, this->fixedItemCoordinatesX);
        lmao->SetBranchingOrder(this->branchingOrder);
        lmao->AddCancellationToken(&feasibleSolutionCancellationToken); // Optional: comment out for sequential mode.
        ////lmao->AddFixedItem(fixedItem);

        subtrees.push_back(std::move(lmao));
    }

    SearchStatus status = SearchStatus::None;

    std::atomic<size_t> exploredSubtrees(0);
    std::atomic<int64_t> exploredNodes(0);
    std::atomic<bool> isFeasible(false);
    Packing2D solution;

    std::mutex mutex;

    std::for_each(
        std::execution::par_unseq,
        subtrees.begin(),
        subtrees.end(),
        [&](std::unique_ptr<LeftmostActiveOnly>& lmao)
        {
            SearchStatus localStatus = lmao->SolveSequential();
            if (localStatus == SearchStatus::Abort)
            {
                status = localStatus;
            }

            if (localStatus == SearchStatus::Feasible)
            {
                mutex.lock();
                solution = lmao->GetSolution();
                mutex.unlock();

                isFeasible.store(true);
            }

            exploredNodes += lmao->GetTreeSize();
            exploredSubtrees++;

            std::cout << "Explored subtrees = " + std::to_string(exploredSubtrees) + " / " + std::to_string(items.size()) + "\n";

            std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();
            endLast = end;
            std::cout << "Elapsed time = " << std::chrono::duration_cast<std::chrono::seconds>(end - begin.load()).count() << "s\n";

            lmao.reset();
        });

    if (status == SearchStatus::Abort)
    {
        std::cout << "Search was aborted.\n";
        return status;
    }

    if (isFeasible.load())
    {
        this->solution = solution;
        status = SearchStatus::Feasible;
        std::cout << "Feasible solution found.\n";
    }
    else
    {
        status = SearchStatus::Infeasible;
        std::cout << "Problem is infeasible.\n";
    }

    std::chrono::steady_clock::time_point endParallelFor = std::chrono::steady_clock::now();

    std::cout << "Elapsed time until after for_each() = " << std::chrono::duration_cast<std::chrono::seconds>(endParallelFor - begin.load()).count() << "s\n";
    std::cout << "Termination delay = " << std::chrono::duration_cast<std::chrono::seconds>(endParallelFor - endLast.load()).count() << "s\n";

    std::cout << "Total explored nodes = " + std::to_string(exploredNodes.load()) + "\n";

    return status;
}